

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtils.cpp
# Opt level: O0

SpatialMotionVector * iDynTree::getRandomTwist(void)

{
  VectorFixSize<3U> *pVVar1;
  double *pdVar2;
  SpatialVector<iDynTree::SpatialMotionVector> *in_RDI;
  double dVar3;
  int i;
  SpatialMotionVector *ret;
  double in_stack_ffffffffffffffd8;
  SpatialVector<iDynTree::SpatialMotionVector> *this;
  undefined4 local_c;
  
  this = in_RDI;
  SpatialMotionVector::SpatialMotionVector((SpatialMotionVector *)0x74c37b);
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    dVar3 = getRandomDouble((double)this,in_stack_ffffffffffffffd8);
    pVVar1 = &SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(this)->super_Vector3;
    pdVar2 = VectorFixSize<3U>::operator()(pVVar1,(long)local_c);
    *pdVar2 = dVar3;
    in_stack_ffffffffffffffd8 = getRandomDouble((double)this,in_stack_ffffffffffffffd8);
    pVVar1 = &SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(this)->super_Vector3;
    pdVar2 = VectorFixSize<3U>::operator()(pVVar1,(long)local_c);
    *pdVar2 = in_stack_ffffffffffffffd8;
  }
  return (SpatialMotionVector *)in_RDI;
}

Assistant:

SpatialMotionVector getRandomTwist()
{
    SpatialMotionVector ret;

    for(int i=0; i < 3; i++ )
    {
        ret.getLinearVec3()(i) = getRandomDouble();
        ret.getAngularVec3()(i) = getRandomDouble();
    }

    return ret;
}